

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxImage * MuxImageRelease(WebPMuxImage *wpi)

{
  long in_RDI;
  WebPMuxImage *next;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (WebPMuxImage *)0x0;
  }
  else {
    ChunkListDelete((WebPChunk **)0x1a5746);
    ChunkListDelete((WebPChunk **)0x1a5754);
    ChunkListDelete((WebPChunk **)0x1a5762);
    ChunkListDelete((WebPChunk **)0x1a5770);
    local_8 = *(WebPMuxImage **)(in_RDI + 0x30);
    MuxImageInit((WebPMuxImage *)0x1a5787);
  }
  return local_8;
}

Assistant:

WebPMuxImage* MuxImageRelease(WebPMuxImage* const wpi) {
  WebPMuxImage* next;
  if (wpi == NULL) return NULL;
  // There should be at most one chunk of header_, alpha_, img_ but we call
  // ChunkListDelete to be safe
  ChunkListDelete(&wpi->header_);
  ChunkListDelete(&wpi->alpha_);
  ChunkListDelete(&wpi->img_);
  ChunkListDelete(&wpi->unknown_);

  next = wpi->next_;
  MuxImageInit(wpi);
  return next;
}